

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall
BRTS_XZ<UFPC>::InitCompressedDataMem
          (BRTS_XZ<UFPC> *this,Data_Compressed *data_compressed,MemMat<unsigned_char> *img)

{
  uint uVar1;
  int *piVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  uint uVar34;
  Mat1b *pMVar35;
  uint64_t *puVar36;
  long lVar37;
  long *plVar38;
  long lVar39;
  long *plVar40;
  bool bVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  uint uVar72;
  long lVar73;
  long lVar74;
  ulong *puVar75;
  long lVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  
  pMVar35 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar67 = (long)*(int *)&pMVar35->field_0x8;
  if (0 < lVar67) {
    uVar34 = *(uint *)&pMVar35->field_0xc;
    puVar36 = data_compressed->bits;
    lVar37 = *(long *)&(img->accesses_).field_0x10;
    plVar38 = *(long **)&(img->accesses_).field_0x48;
    lVar39 = *(long *)&(img->img_).field_0x10;
    plVar40 = *(long **)&(img->img_).field_0x48;
    uVar65 = uVar34 + 0x3f;
    if (-1 < (int)uVar34) {
      uVar65 = uVar34;
    }
    lVar71 = 0;
    do {
      puVar75 = puVar36 + data_compressed->data_width * lVar71;
      lVar68 = lVar37 + 0x80;
      uVar70 = (ulong)(uint)((int)uVar34 >> 6);
      lVar74 = lVar39 + 0x1f;
      if (0 < (int)uVar34 >> 6) {
        do {
          lVar76 = *plVar38 * lVar71;
          piVar2 = (int *)(lVar68 + -0x80 + lVar76);
          *piVar2 = *piVar2 + 1;
          lVar73 = *plVar40 * lVar71;
          uVar66 = (ulong)(*(char *)(lVar74 + -0x1f + lVar73) != '\0');
          piVar2 = (int *)(lVar68 + -0x7c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 + 2;
          if (*(char *)(lVar74 + -0x1e + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x78 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 + 4;
          if (*(char *)(lVar74 + -0x1d + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x74 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 + 8;
          if (*(char *)(lVar74 + -0x1c + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x70 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x10;
          if (*(char *)(lVar74 + -0x1b + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x6c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x20;
          if (*(char *)(lVar74 + -0x1a + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x68 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x40;
          if (*(char *)(lVar74 + -0x19 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -100 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x80;
          if (*(char *)(lVar74 + -0x18 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x60 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x100;
          if (*(char *)(lVar74 + -0x17 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x5c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x200;
          if (*(char *)(lVar74 + -0x16 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x58 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x400;
          if (*(char *)(lVar74 + -0x15 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x54 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x800;
          if (*(char *)(lVar74 + -0x14 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x50 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x1000;
          if (*(char *)(lVar74 + -0x13 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x4c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x2000;
          if (*(char *)(lVar74 + -0x12 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x48 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x4000;
          if (*(char *)(lVar74 + -0x11 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x44 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x8000;
          if (*(char *)(lVar74 + -0x10 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x40 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x10000;
          if (*(char *)(lVar74 + -0xf + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x3c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x20000;
          if (*(char *)(lVar74 + -0xe + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x38 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x40000;
          if (*(char *)(lVar74 + -0xd + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x34 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x80000;
          if (*(char *)(lVar74 + -0xc + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x30 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x100000;
          if (*(char *)(lVar74 + -0xb + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x2c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x200000;
          if (*(char *)(lVar74 + -10 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x28 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x400000;
          if (*(char *)(lVar74 + -9 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x24 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x800000;
          if (*(char *)(lVar74 + -8 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x20 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x1000000;
          if (*(char *)(lVar74 + -7 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x1c + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x2000000;
          if (*(char *)(lVar74 + -6 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x18 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x4000000;
          if (*(char *)(lVar74 + -5 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0x14 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x8000000;
          if (*(char *)(lVar74 + -4 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -0x10 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x10000000;
          if (*(char *)(lVar74 + -3 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -0xc + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x20000000;
          if (*(char *)(lVar74 + -2 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          piVar2 = (int *)(lVar68 + -8 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar66 = uVar69 | 0x40000000;
          if (*(char *)(lVar74 + -1 + lVar73) == '\0') {
            uVar66 = uVar69;
          }
          piVar2 = (int *)(lVar68 + -4 + lVar76);
          *piVar2 = *piVar2 + 1;
          uVar69 = uVar66 | 0x80000000;
          if (*(char *)(lVar74 + lVar73) == '\0') {
            uVar69 = uVar66;
          }
          *(int *)(lVar68 + lVar76) = *(int *)(lVar68 + lVar76) + 1;
          cVar3 = *(char *)(lVar74 + 1 + lVar73);
          piVar2 = (int *)(lVar68 + 4 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar4 = *(char *)(lVar74 + 2 + lVar73);
          *(int *)(lVar68 + 8 + lVar76) = *(int *)(lVar68 + 8 + lVar76) + 1;
          cVar5 = *(char *)(lVar74 + 3 + lVar73);
          *(int *)(lVar68 + 0xc + lVar76) = *(int *)(lVar68 + 0xc + lVar76) + 1;
          cVar6 = *(char *)(lVar74 + 4 + lVar73);
          *(int *)(lVar68 + 0x10 + lVar76) = *(int *)(lVar68 + 0x10 + lVar76) + 1;
          cVar7 = *(char *)(lVar74 + 5 + lVar73);
          *(int *)(lVar68 + 0x14 + lVar76) = *(int *)(lVar68 + 0x14 + lVar76) + 1;
          cVar8 = *(char *)(lVar74 + 6 + lVar73);
          *(int *)(lVar68 + 0x18 + lVar76) = *(int *)(lVar68 + 0x18 + lVar76) + 1;
          cVar9 = *(char *)(lVar74 + 7 + lVar73);
          *(int *)(lVar68 + 0x1c + lVar76) = *(int *)(lVar68 + 0x1c + lVar76) + 1;
          cVar10 = *(char *)(lVar74 + 8 + lVar73);
          *(int *)(lVar68 + 0x20 + lVar76) = *(int *)(lVar68 + 0x20 + lVar76) + 1;
          cVar11 = *(char *)(lVar74 + 9 + lVar73);
          *(int *)(lVar68 + 0x24 + lVar76) = *(int *)(lVar68 + 0x24 + lVar76) + 1;
          cVar12 = *(char *)(lVar74 + 10 + lVar73);
          *(int *)(lVar68 + 0x28 + lVar76) = *(int *)(lVar68 + 0x28 + lVar76) + 1;
          cVar13 = *(char *)(lVar74 + 0xb + lVar73);
          piVar2 = (int *)(lVar68 + 0x2c + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar14 = *(char *)(lVar74 + 0xc + lVar73);
          piVar2 = (int *)(lVar68 + 0x30 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar15 = *(char *)(lVar74 + 0xd + lVar73);
          piVar2 = (int *)(lVar68 + 0x34 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar16 = *(char *)(lVar74 + 0xe + lVar73);
          piVar2 = (int *)(lVar68 + 0x38 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar17 = *(char *)(lVar74 + 0xf + lVar73);
          piVar2 = (int *)(lVar68 + 0x3c + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar18 = *(char *)(lVar74 + 0x10 + lVar73);
          piVar2 = (int *)(lVar68 + 0x40 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar19 = *(char *)(lVar74 + 0x11 + lVar73);
          piVar2 = (int *)(lVar68 + 0x44 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar20 = *(char *)(lVar74 + 0x12 + lVar73);
          piVar2 = (int *)(lVar68 + 0x48 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar21 = *(char *)(lVar74 + 0x13 + lVar73);
          piVar2 = (int *)(lVar68 + 0x4c + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar22 = *(char *)(lVar74 + 0x14 + lVar73);
          piVar2 = (int *)(lVar68 + 0x50 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar23 = *(char *)(lVar74 + 0x15 + lVar73);
          piVar2 = (int *)(lVar68 + 0x54 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar24 = *(char *)(lVar74 + 0x16 + lVar73);
          piVar2 = (int *)(lVar68 + 0x58 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar25 = *(char *)(lVar74 + 0x17 + lVar73);
          piVar2 = (int *)(lVar68 + 0x5c + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar26 = *(char *)(lVar74 + 0x18 + lVar73);
          piVar2 = (int *)(lVar68 + 0x60 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar27 = *(char *)(lVar74 + 0x19 + lVar73);
          piVar2 = (int *)(lVar68 + 100 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar28 = *(char *)(lVar74 + 0x1a + lVar73);
          piVar2 = (int *)(lVar68 + 0x68 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar29 = *(char *)(lVar74 + 0x1b + lVar73);
          piVar2 = (int *)(lVar68 + 0x6c + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar30 = *(char *)(lVar74 + 0x1c + lVar73);
          piVar2 = (int *)(lVar68 + 0x70 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar31 = *(char *)(lVar74 + 0x1d + lVar73);
          piVar2 = (int *)(lVar68 + 0x74 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar32 = *(char *)(lVar74 + 0x1e + lVar73);
          piVar2 = (int *)(lVar68 + 0x78 + lVar76);
          *piVar2 = *piVar2 + 1;
          cVar33 = *(char *)(lVar74 + 0x1f + lVar73);
          piVar2 = (int *)(lVar68 + 0x7c + lVar76);
          *piVar2 = *piVar2 + 1;
          auVar78[0] = -(cVar3 == '\0');
          auVar78[1] = -(cVar4 == '\0');
          auVar78[2] = -(cVar5 == '\0');
          auVar78[3] = -(cVar6 == '\0');
          auVar78[4] = -(cVar7 == '\0');
          auVar78[5] = -(cVar8 == '\0');
          auVar78[6] = -(cVar9 == '\0');
          auVar78[7] = -(cVar10 == '\0');
          auVar78[8] = -(cVar11 == '\0');
          auVar78[9] = -(cVar12 == '\0');
          auVar78[10] = -(cVar13 == '\0');
          auVar78[0xb] = -(cVar14 == '\0');
          auVar78[0xc] = -(cVar15 == '\0');
          auVar78[0xd] = -(cVar16 == '\0');
          auVar78[0xe] = -(cVar17 == '\0');
          bVar41 = cVar18 == '\0';
          auVar78[0xf] = -bVar41;
          auVar77[0] = -(cVar19 == '\0');
          auVar77[1] = -(cVar20 == '\0');
          auVar77[2] = -(cVar21 == '\0');
          auVar77[3] = -(cVar22 == '\0');
          auVar77[4] = -(cVar23 == '\0');
          auVar77[5] = -(cVar24 == '\0');
          auVar77[6] = -(cVar25 == '\0');
          auVar77[7] = -(cVar26 == '\0');
          auVar77[8] = -(cVar27 == '\0');
          auVar77[9] = -(cVar28 == '\0');
          auVar77[10] = -(cVar29 == '\0');
          auVar77[0xb] = -(cVar30 == '\0');
          auVar77[0xc] = -(cVar31 == '\0');
          auVar77[0xd] = -(cVar32 == '\0');
          auVar77[0xe] = -(cVar33 == '\0');
          auVar77[0xf] = -(*(char *)(lVar74 + 0x20 + lVar73) == '\0');
          uVar43 = (ushort)(SUB161(auVar78 >> 7,0) & 1);
          uVar45 = (ushort)(SUB161(auVar78 >> 0xf,0) & 1);
          uVar47 = (ushort)(SUB161(auVar78 >> 0x17,0) & 1);
          uVar49 = (ushort)(SUB161(auVar78 >> 0x1f,0) & 1);
          uVar51 = (ushort)(SUB161(auVar78 >> 0x27,0) & 1);
          uVar53 = (ushort)(SUB161(auVar78 >> 0x2f,0) & 1);
          uVar55 = (ushort)(SUB161(auVar78 >> 0x37,0) & 1);
          uVar42 = uVar43 | uVar45 << 1 | uVar47 << 2 | uVar49 << 3 | uVar51 << 4 | uVar53 << 5 |
                   uVar55 << 6 | (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7;
          uVar58 = (ushort)(SUB161(auVar78 >> 0x47,0) & 1);
          uVar44 = (ushort)(SUB161(auVar77 >> 7,0) & 1);
          uVar46 = (ushort)(SUB161(auVar77 >> 0xf,0) & 1);
          uVar48 = (ushort)(SUB161(auVar77 >> 0x17,0) & 1);
          uVar50 = (ushort)(SUB161(auVar77 >> 0x1f,0) & 1);
          uVar52 = (ushort)(SUB161(auVar77 >> 0x27,0) & 1);
          uVar54 = (ushort)(SUB161(auVar77 >> 0x2f,0) & 1);
          uVar56 = (ushort)(SUB161(auVar77 >> 0x37,0) & 1);
          uVar57 = (ushort)(SUB161(auVar77 >> 0x3f,0) & 1);
          uVar59 = (ushort)(SUB161(auVar77 >> 0x4f,0) & 1);
          uVar60 = (ushort)(SUB161(auVar77 >> 0x57,0) & 1);
          uVar61 = (ushort)(SUB161(auVar77 >> 0x5f,0) & 1);
          uVar62 = (ushort)(SUB161(auVar77 >> 0x67,0) & 1);
          uVar63 = (ushort)(SUB161(auVar77 >> 0x6f,0) & 1);
          uVar64 = (ushort)(SUB161(auVar77 >> 0x77,0) & 1);
          uVar72 = (uint)(ushort)(uVar44 | uVar46 << 1 | uVar48 << 2 | uVar50 << 3 | uVar52 << 4 |
                                  uVar54 << 5 | uVar56 << 6 | uVar57 << 7 |
                                  (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 | uVar59 << 9 |
                                  uVar60 << 10 | uVar61 << 0xb | uVar62 << 0xc | uVar63 << 0xd |
                                  uVar64 << 0xe | (ushort)(auVar77[0xf] >> 7) << 0xf) * 0x10000;
          uVar66 = uVar69 | 0x100000000;
          if (uVar43 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x200000000;
          if (uVar45 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x400000000;
          if (uVar47 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x800000000;
          if (uVar49 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x1000000000;
          if (uVar51 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x2000000000;
          if (uVar53 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x4000000000;
          if (uVar55 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x8000000000;
          if ((char)uVar42 < '\0') {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x10000000000;
          if (uVar58 != 0) {
            uVar66 = uVar69;
          }
          uVar1 = (ushort)(uVar42 | uVar58 << 8 | (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe) + uVar72;
          uVar69 = uVar66 | 0x20000000000;
          if ((uVar1 & 0x200) != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x40000000000;
          if ((uVar1 & 0x400) != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x80000000000;
          if ((uVar1 & 0x800) != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x100000000000;
          if ((uVar1 & 0x1000) != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x200000000000;
          if ((uVar1 & 0x2000) != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x400000000000;
          if ((uVar1 & 0x4000) != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x800000000000;
          if (bVar41) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x1000000000000;
          if (uVar44 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x2000000000000;
          if (uVar46 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x4000000000000;
          if (uVar48 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x8000000000000;
          if (uVar50 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x10000000000000;
          if (uVar52 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x20000000000000;
          if (uVar54 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x40000000000000;
          if (uVar56 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x80000000000000;
          if (uVar57 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x100000000000000;
          if ((auVar77 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x200000000000000;
          if (uVar59 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x400000000000000;
          if (uVar60 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x800000000000000;
          if (uVar61 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x1000000000000000;
          if (uVar62 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x2000000000000000;
          if (uVar63 != 0) {
            uVar69 = uVar66;
          }
          uVar66 = uVar69 | 0x4000000000000000;
          if (uVar64 != 0) {
            uVar66 = uVar69;
          }
          uVar69 = uVar66 | 0x8000000000000000;
          if ((uVar72 & 0x80000000) != 0) {
            uVar69 = uVar66;
          }
          *puVar75 = uVar69;
          puVar75 = puVar75 + 1;
          lVar74 = lVar74 + 0x40;
          lVar68 = lVar68 + 0x100;
          uVar70 = uVar70 - 1;
        } while (uVar70 != 0);
      }
      if ((int)uVar34 % 0x40 < 1) {
        uVar70 = 0;
      }
      else {
        lVar68 = *plVar38;
        lVar74 = *plVar40;
        uVar69 = 0;
        uVar70 = 0;
        do {
          piVar2 = (int *)(lVar68 * lVar71 + lVar37 + (long)(int)(uVar65 & 0xffffffc0) * 4 +
                          uVar69 * 4);
          *piVar2 = *piVar2 + 1;
          uVar66 = 0;
          if (*(char *)(lVar74 * lVar71 + lVar39 + (int)(uVar65 & 0xffffffc0) + uVar69) != '\0') {
            uVar66 = 1L << ((byte)uVar69 & 0x3f);
          }
          uVar70 = uVar70 | uVar66;
          uVar69 = uVar69 + 1;
        } while ((uint)((int)uVar34 % 0x40) != uVar69);
      }
      *puVar75 = uVar70;
      lVar71 = lVar71 + 1;
    } while (lVar71 != lVar67);
  }
  return;
}

Assistant:

void InitCompressedDataMem(Data_Compressed& data_compressed, MemMat<unsigned char>& img) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                int j_base = (j << 6);
                uint64_t obits = 0;
                if (img(i, j_base + 0)) obits |= 0x0000000000000001;
                if (img(i, j_base + 1)) obits |= 0x0000000000000002;
                if (img(i, j_base + 2)) obits |= 0x0000000000000004;
                if (img(i, j_base + 3)) obits |= 0x0000000000000008;
                if (img(i, j_base + 4)) obits |= 0x0000000000000010;
                if (img(i, j_base + 5)) obits |= 0x0000000000000020;
                if (img(i, j_base + 6)) obits |= 0x0000000000000040;
                if (img(i, j_base + 7)) obits |= 0x0000000000000080;
                if (img(i, j_base + 8)) obits |= 0x0000000000000100;
                if (img(i, j_base + 9)) obits |= 0x0000000000000200;
                if (img(i, j_base + 10)) obits |= 0x0000000000000400;
                if (img(i, j_base + 11)) obits |= 0x0000000000000800;
                if (img(i, j_base + 12)) obits |= 0x0000000000001000;
                if (img(i, j_base + 13)) obits |= 0x0000000000002000;
                if (img(i, j_base + 14)) obits |= 0x0000000000004000;
                if (img(i, j_base + 15)) obits |= 0x0000000000008000;
                if (img(i, j_base + 16)) obits |= 0x0000000000010000;
                if (img(i, j_base + 17)) obits |= 0x0000000000020000;
                if (img(i, j_base + 18)) obits |= 0x0000000000040000;
                if (img(i, j_base + 19)) obits |= 0x0000000000080000;
                if (img(i, j_base + 20)) obits |= 0x0000000000100000;
                if (img(i, j_base + 21)) obits |= 0x0000000000200000;
                if (img(i, j_base + 22)) obits |= 0x0000000000400000;
                if (img(i, j_base + 23)) obits |= 0x0000000000800000;
                if (img(i, j_base + 24)) obits |= 0x0000000001000000;
                if (img(i, j_base + 25)) obits |= 0x0000000002000000;
                if (img(i, j_base + 26)) obits |= 0x0000000004000000;
                if (img(i, j_base + 27)) obits |= 0x0000000008000000;
                if (img(i, j_base + 28)) obits |= 0x0000000010000000;
                if (img(i, j_base + 29)) obits |= 0x0000000020000000;
                if (img(i, j_base + 30)) obits |= 0x0000000040000000;
                if (img(i, j_base + 31)) obits |= 0x0000000080000000;
                if (img(i, j_base + 32)) obits |= 0x0000000100000000;
                if (img(i, j_base + 33)) obits |= 0x0000000200000000;
                if (img(i, j_base + 34)) obits |= 0x0000000400000000;
                if (img(i, j_base + 35)) obits |= 0x0000000800000000;
                if (img(i, j_base + 36)) obits |= 0x0000001000000000;
                if (img(i, j_base + 37)) obits |= 0x0000002000000000;
                if (img(i, j_base + 38)) obits |= 0x0000004000000000;
                if (img(i, j_base + 39)) obits |= 0x0000008000000000;
                if (img(i, j_base + 40)) obits |= 0x0000010000000000;
                if (img(i, j_base + 41)) obits |= 0x0000020000000000;
                if (img(i, j_base + 42)) obits |= 0x0000040000000000;
                if (img(i, j_base + 43)) obits |= 0x0000080000000000;
                if (img(i, j_base + 44)) obits |= 0x0000100000000000;
                if (img(i, j_base + 45)) obits |= 0x0000200000000000;
                if (img(i, j_base + 46)) obits |= 0x0000400000000000;
                if (img(i, j_base + 47)) obits |= 0x0000800000000000;
                if (img(i, j_base + 48)) obits |= 0x0001000000000000;
                if (img(i, j_base + 49)) obits |= 0x0002000000000000;
                if (img(i, j_base + 50)) obits |= 0x0004000000000000;
                if (img(i, j_base + 51)) obits |= 0x0008000000000000;
                if (img(i, j_base + 52)) obits |= 0x0010000000000000;
                if (img(i, j_base + 53)) obits |= 0x0020000000000000;
                if (img(i, j_base + 54)) obits |= 0x0040000000000000;
                if (img(i, j_base + 55)) obits |= 0x0080000000000000;
                if (img(i, j_base + 56)) obits |= 0x0100000000000000;
                if (img(i, j_base + 57)) obits |= 0x0200000000000000;
                if (img(i, j_base + 58)) obits |= 0x0400000000000000;
                if (img(i, j_base + 59)) obits |= 0x0800000000000000;
                if (img(i, j_base + 60)) obits |= 0x1000000000000000;
                if (img(i, j_base + 61)) obits |= 0x2000000000000000;
                if (img(i, j_base + 62)) obits |= 0x4000000000000000;
                if (img(i, j_base + 63)) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (img(i, jbase + j)) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }